

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

char * __thiscall cmMakefile::CompileFeaturesAvailable(cmMakefile *this,string *lang,string *error)

{
  cmake *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream e;
  
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this->GlobalGenerator,lang);
  if (bVar2) {
    std::operator+(&bStack_218,"CMAKE_",lang);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                   &bStack_218,"_COMPILE_FEATURES");
    pcVar3 = GetDefinition(this,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)&bStack_218);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      return pcVar3;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pcVar3 = "no";
    if (error == (string *)0x0) {
      pcVar3 = "No";
    }
    std::operator<<((ostream *)&e,pcVar3);
    poVar4 = std::operator<<((ostream *)&e," known features for ");
    poVar4 = std::operator<<(poVar4,(string *)lang);
    poVar4 = std::operator<<(poVar4," compiler\n\"");
    std::operator+(&local_1b8,"CMAKE_",lang);
    std::operator+(&bStack_218,&local_1b8,"_COMPILER_ID");
    pcVar3 = GetSafeDefinition(this,&bStack_218);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4,"\"\nversion ");
    std::operator+(&local_1f8,"CMAKE_",lang);
    std::operator+(&local_1d8,&local_1f8,"_COMPILER_VERSION");
    pcVar3 = GetSafeDefinition(this,&local_1d8);
    poVar4 = std::operator<<(poVar4,pcVar3);
    std::operator<<(poVar4,".");
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&bStack_218);
    std::__cxx11::string::~string((string *)&local_1b8);
    if (error == (string *)0x0) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&bStack_218,&this->Backtrace);
      goto LAB_002f5bae;
    }
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pcVar3 = "cannot";
    if (error == (string *)0x0) {
      pcVar3 = "Cannot";
    }
    std::operator<<((ostream *)&e,pcVar3);
    poVar4 = std::operator<<((ostream *)&e," use features from non-enabled language ");
    std::operator<<(poVar4,(string *)lang);
    if (error == (string *)0x0) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&bStack_218,&this->Backtrace);
      goto LAB_002f5bae;
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::string::operator=((string *)error,(string *)&bStack_218);
LAB_002f5bae:
  std::__cxx11::string::~string((string *)&bStack_218);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return (char *)0x0;
}

Assistant:

const char* cmMakefile::CompileFeaturesAvailable(const std::string& lang,
                                                 std::string* error) const
{
  if (!this->GlobalGenerator->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return CM_NULLPTR;
  }

  const char* featuresKnown =
    this->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!featuresKnown || !*featuresKnown) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_VERSION") << ".";
    if (error) {
      *error = e.str();
    } else {
      this->GetCMakeInstance()->IssueMessage(cmake::FATAL_ERROR, e.str(),
                                             this->Backtrace);
    }
    return CM_NULLPTR;
  }
  return featuresKnown;
}